

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test>
::CreateTest(ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test>
             *this)

{
  undefined8 *puVar1;
  ParamType *ppAVar2;
  
  WithParamInterface<libaom_test::AV1CodecFactory_const*>::parameter_ = &this->parameter_;
  puVar1 = (undefined8 *)operator_new(0x4e0);
  ppAVar2 = WithParamInterface<const_libaom_test::AV1CodecFactory_*>::GetParam();
  puVar1[1] = *ppAVar2;
  *(undefined1 *)(puVar1 + 2) = 0;
  puVar1[0x75] = puVar1 + 0x77;
  puVar1[0x76] = 0;
  *(undefined1 *)(puVar1 + 0x77) = 0;
  puVar1[0x79] = 0;
  puVar1[0x7a] = 0;
  *(undefined4 *)(puVar1 + 0x7b) = 0;
  *(undefined4 *)((long)puVar1 + 0x1c) = 1;
  *puVar1 = &PTR__EncoderTest_0102cc08;
  *(undefined4 *)(puVar1 + 0x82) = 0;
  *(undefined4 *)(puVar1 + 0x87) = 0;
  *(undefined1 *)((long)puVar1 + 0x43c) = 0;
  Test::Test((Test *)(puVar1 + 0x97));
  puVar1[0x9b] = 0xbaba00000000;
  *puVar1 = &PTR__DatarateTestSetFrameQpRealtime_01030278;
  puVar1[0x97] = &PTR__DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test_01030338;
  puVar1[0x99] = &PTR__DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test_01030378;
  return (Test *)(puVar1 + 0x97);
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }